

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Multi_field_small.h
# Opt level: O1

bool Gudhi::persistence_fields::
     Multi_field_element_with_small_characteristics<5U,_13U,_unsigned_int,_void>::_is_prime(uint p)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  
  if (p < 2) {
    bVar4 = false;
  }
  else {
    bVar4 = true;
    if (((3 < p) && (bVar4 = false, (p & 1) != 0)) && (uVar1 = (ulong)p, p % 3 != 0)) {
      bVar4 = p < 0x19;
      if ((!bVar4) && (uVar1 != (uVar1 / 5) * 5)) {
        uVar3 = 0xb;
        do {
          if (uVar1 % (uVar3 - 4) == 0) {
            return bVar4;
          }
          uVar2 = uVar3 * uVar3;
          bVar5 = uVar2 - uVar1 != 0;
          bVar4 = uVar1 <= uVar2 && bVar5;
          if (uVar1 <= uVar2 && bVar5) {
            return bVar4;
          }
          uVar2 = uVar1 % uVar3;
          uVar3 = uVar3 + 6;
        } while (uVar2 != 0);
      }
    }
  }
  return bVar4;
}

Assistant:

static constexpr bool _is_prime(const unsigned int p) {
    if (p <= 1) return false;
    if (p <= 3) return true;
    if (p % 2 == 0 || p % 3 == 0) return false;

    for (unsigned long i = 5; i * i <= p; i = i + 6)
      if (p % i == 0 || p % (i + 2) == 0) return false;

    return true;
  }